

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
google::
dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::serialize<ValueSerializer,_IO_FILE>
          (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,FILE *param_2)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  undefined7 extraout_var;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  int bit;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  byte local_3d;
  uint local_3c;
  long local_38;
  
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                    ((_IO_FILE *)param_2,0x13578642,4);
  if (((bVar3) &&
      (bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                         ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x58),8), bVar3)) &&
     (bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                        ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x50),8), bVar3)) {
    uVar9 = *(ulong *)(this + 0x58);
    uVar4 = CONCAT71(extraout_var,uVar9 == 0);
    if (uVar9 != 0) {
      local_38 = 0;
      uVar10 = 0;
      do {
        iVar7 = *(int *)(this + 0x38);
        lVar6 = 0;
        local_3d = 0;
        do {
          if (lVar6 + uVar10 < uVar9) {
            iVar7 = iVar7 + 1;
            iVar1 = *(int *)(*(long *)(this + 0x70) + local_38 + lVar6 * 4);
            *(int *)(this + 0x38) = iVar7;
            if (*(int *)(this + 0x40) != iVar1) {
              local_3d = local_3d | (byte)(1 << ((byte)lVar6 & 0x1f));
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        local_3c = (uint)uVar4;
        sVar5 = fwrite(&local_3d,1,1,param_2);
        bVar2 = local_3d;
        if (sVar5 != 1) {
LAB_0096e905:
          uVar4 = (ulong)local_3c;
          break;
        }
        lVar8 = 0;
        sVar5 = 0;
        lVar6 = local_38;
        do {
          if (((bVar2 >> ((uint)lVar8 & 0x1f) & 1) != 0) &&
             (sVar5 = fwrite((void *)(*(long *)(this + 0x70) + lVar6),4,1,param_2), sVar5 != 1))
          goto LAB_0096e905;
          lVar8 = lVar8 + 1;
          lVar6 = lVar6 + 4;
        } while (lVar8 != 8);
        uVar10 = uVar10 + 8;
        uVar9 = *(ulong *)(this + 0x58);
        local_38 = local_38 + 0x20;
        uVar4 = CONCAT71((int7)(sVar5 >> 8),uVar10 >= uVar9);
      } while (uVar10 < uVar9);
    }
  }
  else {
    uVar4 = 0;
  }
  return (bool)((byte)uVar4 & 1);
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }